

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxfastrt.hpp
# Opt level: O2

bool __thiscall
soplex::SPxFastRT<double>::shortEnter
          (SPxFastRT<double> *this,SPxId *enterId,int nr,double max,double maxabs)

{
  double dVar1;
  SPxSolverBase<double> *pSVar2;
  byte bVar3;
  int iVar4;
  long lVar5;
  ulong uVar6;
  double dVar7;
  __shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> local_30;
  
  std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_30,
             &(this->super_SPxRatioTester<double>)._tolerances.
              super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
  dVar1 = (local_30._M_ptr)->s_epsilon_multiplier;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30._M_refcount);
  pSVar2 = (this->super_SPxRatioTester<double>).thesolver;
  iVar4 = pSVar2->theRep * (enterId->super_DataKey).info;
  if (iVar4 < 0) {
    lVar5 = 0x6b8;
  }
  else {
    if (iVar4 == 0) {
      bVar3 = 0;
      goto LAB_001d45d1;
    }
    lVar5 = 0x6c0;
  }
  if ((max != 0.0) || (NAN(max))) {
    uVar6 = -(ulong)(dVar1 == 1.0);
    dVar7 = (double)(~uVar6 & (ulong)(dVar1 * 1e-05) | uVar6 & 0x3ee4f8b588e368f1) * maxabs;
    dVar1 = *(double *)
             (*(long *)(*(long *)((long)&(pSVar2->super_SPxLPBase<double>).
                                         super_LPRowSetBase<double>.super_SVSetBase<double>.
                                         super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray
                                 + lVar5) + 0x40) + (long)nr * 8);
    bVar3 = -(dVar7 <= -dVar1) | -(dVar7 <= dVar1);
  }
  else {
    bVar3 = 1;
  }
LAB_001d45d1:
  return (bool)(bVar3 & 1);
}

Assistant:

bool SPxFastRT<R>::shortEnter(
   const SPxId& enterId,
   int nr,
   R max,
   R maxabs) const
{
   R shortval = this->tolerances()->scaleAccordingToEpsilon(SOPLEX_SHORTVAL);

   if(this->thesolver->isCoId(enterId))
   {
      if(max != 0.0)
      {
         R x = this->thesolver->coPvec().delta()[nr];

         if(x < maxabs * shortval && -x < maxabs * shortval)
            return false;
      }

      return true;
   }
   else if(this->thesolver->isId(enterId))
   {
      if(max != 0.0)
      {
         R x = this->thesolver->pVec().delta()[nr];

         if(x < maxabs * shortval && -x < maxabs * shortval)
            return false;
      }

      return true;
   }

   return false;
}